

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger_impl.h
# Opt level: O3

void __thiscall
spdlog::async_logger::async_logger<std::shared_ptr<spdlog::sinks::sink>const*>
          (async_logger *this,string *logger_name,shared_ptr<spdlog::sinks::sink> **begin,
          shared_ptr<spdlog::sinks::sink> **end,size_t queue_size,
          async_overflow_policy overflow_policy,function<void_()> *worker_warmup_cb,
          milliseconds *flush_interval_ms,function<void_()> *worker_teardown_cb)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *this_00;
  log_err_handler *__x;
  pointer pcVar2;
  async_log_helper *this_01;
  undefined1 local_fd;
  async_overflow_policy local_fc;
  formatter_ptr local_f8;
  char *local_e8;
  size_type local_e0;
  char local_d8;
  undefined7 uStack_d7;
  undefined8 uStack_d0;
  anon_class_8_1_8991fb9c local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_c0 [2];
  size_t local_b0;
  _Any_data local_a8;
  code *local_98;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  local_88;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  pcVar2 = (logger_name->_M_dataplus)._M_p;
  local_fc = overflow_policy;
  local_e8 = &local_d8;
  local_b0 = queue_size;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar2,pcVar2 + logger_name->_M_string_length);
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__logger_001aea70;
  paVar1 = &(this->super_logger)._name.field_2;
  (this->super_logger)._name._M_dataplus._M_p = (pointer)paVar1;
  if (local_e8 == &local_d8) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_d7,local_d8);
    *(undefined8 *)((long)&(this->super_logger)._name.field_2 + 8) = uStack_d0;
  }
  else {
    (this->super_logger)._name._M_dataplus._M_p = local_e8;
    (this->super_logger)._name.field_2._M_allocated_capacity = CONCAT71(uStack_d7,local_d8);
  }
  (this->super_logger)._name._M_string_length = local_e0;
  local_e0 = 0;
  local_d8 = '\0';
  this_00 = &(this->super_logger)._sinks;
  local_e8 = &local_d8;
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>
  ::vector<std::shared_ptr<spdlog::sinks::sink>const*,void>
            ((vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>
              *)this_00,*begin,*end,(allocator_type *)&local_c8);
  local_c8.this = (logger *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<spdlog::pattern_formatter,std::allocator<spdlog::pattern_formatter>,char_const(&)[3]>
            (a_Stack_c0,(pattern_formatter **)&local_c8,
             (allocator<spdlog::pattern_formatter> *)&local_fd,(char (*) [3])"%+");
  (this->super_logger)._formatter.super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_c8.this;
  (this->super_logger)._formatter.super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = a_Stack_c0[0]._M_pi;
  (this->super_logger)._level = (__atomic_base<int>)0x2;
  (this->super_logger)._flush_level = (__atomic_base<int>)0x6;
  __x = &(this->super_logger)._err_handler;
  *(undefined8 *)&(this->super_logger)._err_handler.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_logger)._err_handler.super__Function_base._M_functor + 8) = 0;
  (this->super_logger)._err_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_logger)._err_handler._M_invoker = (_Invoker_type)0x0;
  (this->super_logger)._last_err_time.super___atomic_base<long>._M_i = 0;
  (this->super_logger)._msg_counter.super___atomic_base<unsigned_long>._M_i = 1;
  local_c8.this = &this->super_logger;
  std::function<void(std::__cxx11::string_const&)>::operator=
            ((function<void(std::__cxx11::string_const&)> *)__x,&local_c8);
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__async_logger_001aeb68;
  this_01 = (async_log_helper *)operator_new(0x1c8);
  local_f8.super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_logger)._formatter.
       super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f8.super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->super_logger)._formatter.
       super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_f8.super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f8.super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_f8.super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f8.super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_f8.super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::vector(&local_88,this_00);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_a8,__x);
  std::function<void_()>::function((function<void_()> *)&local_50,worker_warmup_cb);
  std::function<void_()>::function((function<void_()> *)&local_70,worker_teardown_cb);
  details::async_log_helper::async_log_helper
            (this_01,&local_f8,&local_88,local_b0,(log_err_handler *)&local_a8,local_fc,
             (function<void_()> *)&local_50,flush_interval_ms,(function<void_()> *)&local_70);
  (this->_async_log_helper)._M_t.
  super___uniq_ptr_impl<spdlog::details::async_log_helper,_std::default_delete<spdlog::details::async_log_helper>_>
  ._M_t.
  super__Tuple_impl<0UL,_spdlog::details::async_log_helper_*,_std::default_delete<spdlog::details::async_log_helper>_>
  .super__Head_base<0UL,_spdlog::details::async_log_helper_*,_false>._M_head_impl = this_01;
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::~vector(&local_88);
  if (local_f8.super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

inline spdlog::async_logger::async_logger(const std::string &logger_name, const It &begin, const It &end, size_t queue_size,
    const async_overflow_policy overflow_policy, const std::function<void()> &worker_warmup_cb,
    const std::chrono::milliseconds &flush_interval_ms, const std::function<void()> &worker_teardown_cb)
    : logger(logger_name, begin, end)
    , _async_log_helper(new details::async_log_helper(
          _formatter, _sinks, queue_size, _err_handler, overflow_policy, worker_warmup_cb, flush_interval_ms, worker_teardown_cb))
{
}